

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int fUseMuxes_local;
  int fFirst_local;
  Vec_Ptr_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if ((((iVar1 == 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) &&
      ((fFirst != 0 || (iVar1 = Gia_ObjValue(pObj), iVar1 < 2)))) &&
     ((fUseMuxes == 0 || (iVar1 = Gia_ObjIsMuxType(pObj), iVar1 == 0)))) {
    pGVar2 = Gia_ObjChild0(pObj);
    Cec_CollectSuper_rec(pGVar2,vSuper,0,fUseMuxes);
    pGVar2 = Gia_ObjChild1(pObj);
    Cec_CollectSuper_rec(pGVar2,vSuper,0,fUseMuxes);
    return;
  }
  Vec_PtrPushUnique(vSuper,pObj);
  return;
}

Assistant:

void Cec_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && Gia_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}